

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

SceneObject * __thiscall
CMU462::Application::init_sphere(Application *this,SphereInfo *sphere,Matrix4x4 *transform)

{
  Sphere *this_00;
  Vector4D local_a8;
  Vector4D local_80;
  double local_60;
  double local_58;
  double local_50;
  Vector3D local_48;
  
  local_a8.z = 0.0;
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.w = 1.0;
  Matrix4x4::operator*(transform,&local_a8);
  Vector4D::projectTo3D(&local_80);
  local_a8.x = 1.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  local_a8.w = 0.0;
  Matrix4x4::operator*(transform,&local_a8);
  Vector4D::to3D(&local_80);
  this_00 = (Sphere *)operator_new(0x120);
  DynamicScene::Sphere::Sphere
            (this_00,sphere,&local_48,
             SQRT(local_50 * local_50 + local_60 * local_60 + local_58 * local_58));
  return &this_00->super_SceneObject;
}

Assistant:

DynamicScene::SceneObject *Application::init_sphere(
    SphereInfo &sphere, const Matrix4x4 &transform) {
  const Vector3D &position = (transform * Vector4D(0, 0, 0, 1)).projectTo3D();
  double scale = (transform * Vector4D(1, 0, 0, 0)).to3D().norm();
  return new DynamicScene::Sphere(sphere, position, scale);
}